

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

int dict_write(dict_t *dict,char *filename,char *format)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  char *__src;
  dictword_t *pdVar4;
  size_t elem_size;
  s3wid_t w;
  long lVar5;
  int iVar6;
  int32 pos;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                   ,0xe1,"Failed to open \'%s\'",filename);
    iVar1 = -1;
  }
  else {
    if (0 < dict->n_word) {
      lVar5 = 0;
      do {
        w = (s3wid_t)lVar5;
        iVar1 = dict_real_word(dict,w);
        if (iVar1 != 0) {
          if (dict->word[lVar5].pronlen < 1) {
            elem_size = 0;
          }
          else {
            iVar6 = 0;
            iVar1 = 0;
            do {
              pcVar2 = dict_ciphone_str(dict,w,iVar1);
              sVar3 = strlen(pcVar2);
              iVar6 = iVar6 + (int)sVar3 + 1;
              iVar1 = iVar1 + 1;
            } while (iVar1 < dict->word[lVar5].pronlen);
            elem_size = (size_t)iVar6;
          }
          pcVar2 = (char *)__ckd_calloc__(1,elem_size,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                                          ,0xeb);
          pdVar4 = dict->word;
          if (0 < pdVar4[lVar5].pronlen) {
            pos = 0;
            do {
              __src = dict_ciphone_str(dict,w,pos);
              strcat(pcVar2,__src);
              if (pos != dict->word[lVar5].pronlen + -1) {
                sVar3 = strlen(pcVar2);
                (pcVar2 + sVar3)[0] = ' ';
                (pcVar2 + sVar3)[1] = '\0';
              }
              pos = pos + 1;
              pdVar4 = dict->word;
            } while (pos < pdVar4[lVar5].pronlen);
          }
          fprintf(__stream,"%-30s %s\n",pdVar4[lVar5].word,pcVar2);
          ckd_free(pcVar2);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < dict->n_word);
    }
    fclose(__stream);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
dict_write(dict_t *dict, char const *filename, char const *format)
{
    FILE *fh;
    int i;

    (void)format; /* FIXME */
    if ((fh = fopen(filename, "w")) == NULL) {
        E_ERROR_SYSTEM("Failed to open '%s'", filename);
        return -1;
    }
    for (i = 0; i < dict->n_word; ++i) {
        char *phones;
        int j, phlen;
        if (!dict_real_word(dict, i))
            continue;
        for (phlen = j = 0; j < dict_pronlen(dict, i); ++j)
            phlen += strlen(dict_ciphone_str(dict, i, j)) + 1;
        phones = ckd_calloc(1, phlen);
        for (j = 0; j < dict_pronlen(dict, i); ++j) {
            strcat(phones, dict_ciphone_str(dict, i, j));
            if (j != dict_pronlen(dict, i) - 1)
                strcat(phones, " ");
        }
        fprintf(fh, "%-30s %s\n", dict_wordstr(dict, i), phones);
        ckd_free(phones);
    }
    fclose(fh);
    return 0;
}